

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O2

QPointF __thiscall QGestureEvent::mapToGraphicsScene(QGestureEvent *this,QPointF *gesturePoint)

{
  QWidget *this_00;
  QObject *object;
  long in_FS_OFFSET;
  QPointF QVar1;
  QPoint local_28;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_widget == (QWidget *)0x0) {
    object = (QObject *)0x0;
  }
  else {
    object = *(QObject **)(*(long *)&this->m_widget->field_0x8 + 0x10);
  }
  this_00 = (QWidget *)QtPrivate::qobject_cast_helper<QGraphicsView*,QObject>(object);
  if (this_00 == (QWidget *)0x0) {
    QVar1 = (QPointF)ZEXT816(0);
  }
  else {
    local_28 = QPointF::toPoint(gesturePoint);
    local_20 = QWidget::mapFromGlobal(this_00,&local_28);
    QVar1 = QGraphicsView::mapToScene((QGraphicsView *)this_00,&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGestureEvent::mapToGraphicsScene(const QPointF &gesturePoint) const
{
    QWidget *w = widget();
    if (w) // we get the viewport as widget, not the graphics view
        w = w->parentWidget();
    QGraphicsView *view = qobject_cast<QGraphicsView*>(w);
    if (view) {
        return view->mapToScene(view->mapFromGlobal(gesturePoint.toPoint()));
    }
    return QPointF();
}